

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMeshType.cpp
# Opt level: O0

int MMeshType_Dimension(MMeshType meshType)

{
  uint in_EDI;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  undefined4 local_4;
  
  if (in_EDI < 2) {
    local_4 = 2;
  }
  else if (in_EDI - 2 < 5) {
    local_4 = 3;
  }
  else if (in_EDI == 7) {
    local_4 = -1;
  }
  else {
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int MMeshType_Dimension(const MMeshType meshType){
    switch(meshType){
        case MMeshType::ETriangular:
        case MMeshType::EQuadrilateral:
            return 2;
        case MMeshType::ETetrahedral:
        case MMeshType::EPyramidal:
        case MMeshType::EPrismatic:
        case MMeshType::EHexahedral:
        case MMeshType::EHexaPyrMixed:
            return 3;
        case MMeshType::ENoType:
            return -1;
    }
    DebugStop();
    return -1;

}